

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

bool __thiscall
deqp::UniformBlockCase::compareTypes
          (UniformBlockCase *this,UniformLayout *refLayout,UniformLayout *cmpLayout)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TestLog *this_00;
  UniformBlock *this_01;
  char *pcVar5;
  ostream *poVar6;
  reference piVar7;
  MessageBuilder *pMVar8;
  int local_554;
  char *local_540;
  char *local_538;
  MessageBuilder local_530;
  const_reference local_3b0;
  UniformLayoutEntry *refEntry;
  int local_224;
  const_reference pvStack_220;
  int refEntryNdx;
  UniformLayoutEntry *cmpEntry;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_210;
  const_iterator ndxIter;
  BlockLayoutEntry *cmpBlockLayout;
  string local_1f8 [32];
  int local_1d8;
  int cmpBlockNdx;
  undefined1 local_1c8 [8];
  ostringstream instanceName;
  int instanceNdx;
  int numInstances;
  bool isArray;
  UniformBlock *block;
  int blockNdx;
  int numBlocks;
  bool isOk;
  TestLog *log;
  UniformLayout *cmpLayout_local;
  UniformLayout *refLayout_local;
  UniformBlockCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  blockNdx._3_1_ = true;
  iVar3 = ub::ShaderInterface::getNumUniformBlocks(&this->m_interface);
  for (block._4_4_ = 0; block._4_4_ < iVar3; block._4_4_ = block._4_4_ + 1) {
    this_01 = ub::ShaderInterface::getUniformBlock(&this->m_interface,block._4_4_);
    bVar1 = ub::UniformBlock::isArray(this_01);
    if (bVar1) {
      local_554 = ub::UniformBlock::getArraySize(this_01);
    }
    else {
      local_554 = 1;
    }
    for (instanceName._372_4_ = 0; (int)instanceName._372_4_ < local_554;
        instanceName._372_4_ = instanceName._372_4_ + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      pcVar5 = ub::UniformBlock::getBlockName(this_01);
      std::operator<<((ostream *)local_1c8,pcVar5);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)local_1c8,"[");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,instanceName._372_4_);
        std::operator<<(poVar6,"]");
      }
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iVar4 = ub::UniformLayout::getBlockIndex(cmpLayout,pcVar5);
      std::__cxx11::string::~string(local_1f8);
      local_1d8 = iVar4;
      if (-1 < iVar4) {
        ndxIter._M_current =
             (int *)std::
                    vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                    ::operator[](&cmpLayout->blocks,(long)iVar4);
        local_210._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              (&((const_reference)ndxIter._M_current)->activeUniformIndices);
        while( true ) {
          cmpEntry = (UniformLayoutEntry *)
                     std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)(ndxIter._M_current + 10));
          bVar2 = __gnu_cxx::operator!=
                            (&local_210,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&cmpEntry);
          if (!bVar2) break;
          piVar7 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_210);
          pvStack_220 = std::
                        vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                        ::operator[](&cmpLayout->uniforms,(long)*piVar7);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          local_224 = ub::UniformLayout::getUniformIndex(refLayout,pcVar5);
          if (local_224 < 0) {
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&refEntry,this_00,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar8 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&refEntry,(char (*) [17])"Error: Uniform \'");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&pvStack_220->name);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [32])"\' not found in reference layout");
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&refEntry);
            blockNdx._3_1_ = false;
          }
          else {
            local_3b0 = std::
                        vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                        ::operator[](&refLayout->uniforms,(long)local_224);
            if (local_3b0->type != pvStack_220->type) {
              tcu::TestLog::operator<<
                        (&local_530,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (&local_530,(char (*) [34])"Error: Uniform type mismatch in \'");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_3b0->name);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])"\':\n");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])"  expected: ");
              local_538 = glu::getDataTypeName(local_3b0->type);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_538);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b9e07b);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [8])"  got: ");
              local_540 = glu::getDataTypeName(pvStack_220->type);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_540);
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_530);
              blockNdx._3_1_ = false;
            }
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_210,0);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    }
  }
  return blockNdx._3_1_;
}

Assistant:

bool UniformBlockCase::compareTypes(const UniformLayout& refLayout, const UniformLayout& cmpLayout) const
{
	TestLog& log	   = m_testCtx.getLog();
	bool	 isOk	  = true;
	int		 numBlocks = m_interface.getNumUniformBlocks();

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const UniformBlock& block		 = m_interface.getUniformBlock(blockNdx);
		bool				isArray		 = block.isArray();
		int					numInstances = isArray ? block.getArraySize() : 1;

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::ostringstream instanceName;

			instanceName << block.getBlockName();
			if (isArray)
				instanceName << "[" << instanceNdx << "]";

			int cmpBlockNdx = cmpLayout.getBlockIndex(instanceName.str().c_str());

			if (cmpBlockNdx < 0)
				continue;

			const BlockLayoutEntry& cmpBlockLayout = cmpLayout.blocks[cmpBlockNdx];

			for (vector<int>::const_iterator ndxIter = cmpBlockLayout.activeUniformIndices.begin();
				 ndxIter != cmpBlockLayout.activeUniformIndices.end(); ndxIter++)
			{
				const UniformLayoutEntry& cmpEntry	= cmpLayout.uniforms[*ndxIter];
				int						  refEntryNdx = refLayout.getUniformIndex(cmpEntry.name.c_str());

				if (refEntryNdx < 0)
				{
					log << TestLog::Message << "Error: Uniform '" << cmpEntry.name << "' not found in reference layout"
						<< TestLog::EndMessage;
					isOk = false;
					continue;
				}

				const UniformLayoutEntry& refEntry = refLayout.uniforms[refEntryNdx];

				// \todo [2012-11-26 pyry] Should we check other properties as well?
				if (refEntry.type != cmpEntry.type)
				{
					log << TestLog::Message << "Error: Uniform type mismatch in '" << refEntry.name << "':\n"
						<< "  expected: " << glu::getDataTypeName(refEntry.type) << "\n"
						<< "  got: " << glu::getDataTypeName(cmpEntry.type) << TestLog::EndMessage;
					isOk = false;
				}
			}
		}
	}

	return isOk;
}